

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderSwitchTests.cpp
# Opt level: O1

TestCase *
deqp::gles3::Functional::makeSwitchCase
          (Context *context,char *name,char *desc,SwitchType type,bool isVertex,
          LineStream *switchBody)

{
  _Alloc_hider _Var1;
  mapped_type *pmVar2;
  size_t sVar3;
  ShaderSwitchCase *this;
  code *evalFunc;
  code *pcVar4;
  long lVar5;
  char *pcVar6;
  ostringstream *poVar7;
  char *__s;
  allocator<char> local_3d1;
  key_type local_3d0;
  StringTemplate local_3b0;
  char *local_390;
  Context *local_388;
  char *local_380;
  LineStream *local_378;
  string local_370;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream vtx;
  ostringstream frag;
  
  local_388 = context;
  local_380 = name;
  local_378 = switchBody;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar7 = (ostringstream *)&frag;
  if (isVertex) {
    poVar7 = (ostringstream *)&vtx;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"in highp vec4 a_position;\n",
             0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"in highp vec4 a_coords;\n",
             0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
             "layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if (isVertex) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"out mediump vec4 v_color;\n"
               ,0x1a);
    lVar5 = 0x19;
    pcVar6 = "in mediump vec4 v_color;\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"out highp vec4 v_coords;\n",
               0x19);
    lVar5 = 0x18;
    pcVar6 = "in highp vec4 v_coords;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,lVar5);
  if (type == SWITCHTYPE_UNIFORM) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar7,"uniform highp int ui_two;\n",0x1a);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tgl_Position = a_position;\n"
             ,0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main (void)\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar7,"\thighp vec4 coords = ",0x15);
  pcVar6 = "v_coords";
  if (isVertex) {
    pcVar6 = "a_coords";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,pcVar6,8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar7,"\tmediump vec3 res = vec3(0.0);\n\n",0x20);
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar6 = "ui_two";
  if (type == SWITCHTYPE_STATIC) {
    pcVar6 = "2";
  }
  __s = "???";
  if (type == SWITCHTYPE_DYNAMIC) {
    __s = "int(floor(coords.z*1.5 + 2.0))";
  }
  if (type < SWITCHTYPE_DYNAMIC) {
    __s = pcVar6;
  }
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"CONDITION","");
  local_390 = desc;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&params,&local_3d0);
  pcVar6 = (char *)pmVar2->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar2,0,pcVar6,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = deqp::gls::LineStream::str(local_378);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar6,&local_3d1);
  tcu::StringTemplate::StringTemplate(&local_3b0,&local_370);
  tcu::StringTemplate::specialize(&local_3d0,&local_3b0,&params);
  _Var1._M_p = local_3d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar7 + -0x18) + (int)poVar7);
  }
  else {
    sVar3 = strlen(local_3d0._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,_Var1._M_p,sVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
  if (isVertex) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
               "\tv_color = vec4(res, 1.0);\n",0x1b);
    lVar5 = 0x14;
    pcVar6 = "\to_color = v_color;\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_coords = a_coords;\n",
               0x16);
    lVar5 = 0x1b;
    pcVar6 = "\to_color = vec4(res, 1.0);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
  this = (ShaderSwitchCase *)operator_new(0x128);
  std::__cxx11::stringbuf::str();
  _Var1._M_p = local_3d0._M_dataplus._M_p;
  std::__cxx11::stringbuf::str();
  pcVar4 = evalSwitchUniform;
  if (type == SWITCHTYPE_STATIC) {
    pcVar4 = evalSwitchStatic;
  }
  evalFunc = (ShaderEvalFunc)0x0;
  if (type == SWITCHTYPE_DYNAMIC) {
    evalFunc = evalSwitchDynamic;
  }
  if (type < SWITCHTYPE_DYNAMIC) {
    evalFunc = pcVar4;
  }
  ShaderSwitchCase::ShaderSwitchCase
            (this,local_388,local_380,local_390,isVertex,_Var1._M_p,
             local_3b0.m_template._M_dataplus._M_p,evalFunc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_template._M_dataplus._M_p != &local_3b0.m_template.field_2) {
    operator_delete(local_3b0.m_template._M_dataplus._M_p,
                    local_3b0.m_template.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::ios_base::~ios_base
            ((ios_base *)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  std::ios_base::~ios_base
            ((ios_base *)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  return (TestCase *)this;
}

Assistant:

static tcu::TestCase* makeSwitchCase (Context& context, const char* name, const char* desc, SwitchType type, bool isVertex, const LineStream& switchBody)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertex ? vtx : frag;

	vtx << "#version 300 es\n"
		<< "in highp vec4 a_position;\n"
		<< "in highp vec4 a_coords;\n";
	frag << "#version 300 es\n"
		 << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVertex)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out highp vec4 v_coords;\n";
		frag << "in highp vec4 v_coords;\n";
	}

	if (type == SWITCHTYPE_UNIFORM)
		op << "uniform highp int ui_two;\n";

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	// Setup.
	op << "	highp vec4 coords = " << (isVertex ? "a_coords" : "v_coords") << ";\n";
	op << "	mediump vec3 res = vec3(0.0);\n\n";

	// Switch body.
	map<string, string> params;
	params["CONDITION"] = type == SWITCHTYPE_STATIC		? "2"								:
						  type == SWITCHTYPE_UNIFORM	? "ui_two"							:
						  type == SWITCHTYPE_DYNAMIC	? "int(floor(coords.z*1.5 + 2.0))"	: "???";

	op << tcu::StringTemplate(switchBody.str()).specialize(params).c_str();
	op << "\n";

	if (isVertex)
	{
		vtx << "	v_color = vec4(res, 1.0);\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		vtx << "	v_coords = a_coords;\n";
		frag << "	o_color = vec4(res, 1.0);\n";
	}

	vtx << "}\n";
	frag << "}\n";

	return new ShaderSwitchCase(context, name, desc, isVertex, vtx.str().c_str(), frag.str().c_str(),
								type == SWITCHTYPE_STATIC	? evalSwitchStatic	:
								type == SWITCHTYPE_UNIFORM	? evalSwitchUniform	:
								type == SWITCHTYPE_DYNAMIC	? evalSwitchDynamic	: (ShaderEvalFunc)DE_NULL);
}